

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositedBupOutputter.cpp
# Opt level: O0

ssize_t __thiscall
CompositedBupOutputter::write(CompositedBupOutputter *this,int __fd,void *__buf,size_t __n)

{
  ulong uVar1;
  ssize_t sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__source;
  path *in_stack_fffffffffffffe50;
  path *ppVar3;
  path *in_stack_fffffffffffffe70;
  path *in_stack_fffffffffffffe78;
  string local_168 [72];
  undefined1 local_120 [40];
  path local_f8;
  undefined1 local_b0 [56];
  string local_78 [72];
  undefined1 local_30 [40];
  CompositedBupOutputter *local_8;
  
  local_8 = this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    ppVar3 = (path *)&this->withMouth;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ppVar3,
                   (char *)in_stack_fffffffffffffe70);
    std::filesystem::__cxx11::u8path<std::__cxx11::string,std::filesystem::__cxx11::path,char>
              (in_stack_fffffffffffffe48);
    std::filesystem::__cxx11::operator/(ppVar3,in_stack_fffffffffffffe70);
    (*(this->super_BupOutputter)._vptr_BupOutputter[6])(this,ppVar3,local_30);
    std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffe50);
    std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffe50);
    sVar2 = std::__cxx11::string::~string(local_78);
  }
  else {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      ppVar3 = &local_f8;
      std::operator+(&in_stack_fffffffffffffe78->_M_pathname,(char *)ppVar3);
      std::filesystem::__cxx11::u8path<std::__cxx11::string,std::filesystem::__cxx11::path,char>
                (in_stack_fffffffffffffe48);
      std::filesystem::__cxx11::operator/(in_stack_fffffffffffffe78,ppVar3);
      (*(this->super_BupOutputter)._vptr_BupOutputter[6])(this,&this->withFace,local_b0);
      std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffe50);
      std::filesystem::__cxx11::path::~path(in_stack_fffffffffffffe50);
      sVar2 = std::__cxx11::string::~string((string *)&local_f8);
    }
    else {
      __source = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->base;
      ppVar3 = &this->basePath;
      std::operator+(&in_stack_fffffffffffffe78->_M_pathname,(char *)in_stack_fffffffffffffe70);
      std::filesystem::__cxx11::u8path<std::__cxx11::string,std::filesystem::__cxx11::path,char>
                (__source);
      std::filesystem::__cxx11::operator/(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      (*(this->super_BupOutputter)._vptr_BupOutputter[6])(this,__source,local_120);
      std::filesystem::__cxx11::path::~path(ppVar3);
      std::filesystem::__cxx11::path::~path(ppVar3);
      sVar2 = std::__cxx11::string::~string(local_168);
    }
  }
  return sVar2;
}

Assistant:

void write() override {
		if (!withMouthName.empty()) {
			write(withMouth, basePath/fs::u8path(withMouthName + ".png"));
		}
		else if (!withFaceName.empty()) {
			write(withFace, basePath/fs::u8path(withFaceName + ".png"));
		}
		else {
			write(base, basePath/fs::u8path(baseName + ".png"));
		}
	}